

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

void Cec_AddClausesMux(Cec_ManSat_t *p,Gia_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Gia_Obj_t *pObj;
  undefined4 extraout_var;
  uint uVar6;
  char *__assertion;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int pLits [4];
  Gia_Obj_t *pNodeE;
  Gia_Obj_t *pNodeT;
  undefined8 local_40;
  ulong local_38;
  
  if (((ulong)pNode & 1) == 0) {
    iVar2 = Gia_ObjIsMuxType(pNode);
    if (iVar2 == 0) {
      __assertion = "Gia_ObjIsMuxType( pNode )";
      uVar1 = 0x46;
    }
    else {
      pObj = Gia_ObjRecognizeMux(pNode,&pNodeT,&pNodeE);
      iVar3 = Cec_ObjSatNum(p,pNode);
      iVar2 = Cec_ObjSatNum(p,pObj);
      uVar4 = Cec_ObjSatNum(p,(Gia_Obj_t *)((ulong)pNodeT & 0xfffffffffffffffe));
      iVar5 = Cec_ObjSatNum(p,(Gia_Obj_t *)
                              (CONCAT44(pNodeE._4_4_,(uint)pNodeE) & 0xfffffffffffffffe));
      uVar8 = (uint)pNodeE;
      local_40 = CONCAT44(extraout_var,iVar5);
      iVar5 = iVar2 * 2;
      iVar2 = iVar2 * 2 + 1;
      uVar7 = ((uint)pNodeT & 1) + uVar4 * 2;
      uVar6 = uVar7 ^ 1;
      uVar1 = iVar3 * 2;
      pLits[0] = iVar2;
      pLits[1] = uVar6;
      pLits[2] = uVar1;
      if (p->pPars->fPolarFlip != 0) {
        if (*(long *)pObj < 0) {
          pLits[0] = iVar5;
        }
        if (*(long *)((ulong)pNodeT & 0xfffffffffffffffe) < 0) {
          pLits[1] = uVar7;
        }
        if (*(long *)pNode < 0) {
          pLits[2] = uVar1 | 1;
        }
      }
      local_38 = (ulong)uVar4;
      iVar3 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
      if (iVar3 == 0) {
        __assertion = "RetValue";
        uVar1 = 100;
      }
      else {
        uVar4 = uVar1 | 1;
        pLits[0] = iVar2;
        pLits[1] = uVar7;
        pLits[2] = uVar4;
        if (p->pPars->fPolarFlip != 0) {
          if (*(long *)pObj < 0) {
            pLits[0] = iVar5;
          }
          if (*(long *)((ulong)pNodeT & 0xfffffffffffffffe) < 0) {
            pLits[1] = uVar6;
          }
          if (*(long *)pNode < 0) {
            pLits[2] = uVar1;
          }
        }
        iVar3 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
        if (iVar3 == 0) {
          __assertion = "RetValue";
          uVar1 = 0x6f;
        }
        else {
          uVar8 = (uVar8 & 1) + (int)local_40 * 2;
          uVar9 = uVar8 ^ 1;
          pLits[0] = iVar5;
          pLits[1] = uVar9;
          pLits[2] = uVar1;
          if (p->pPars->fPolarFlip != 0) {
            if (*(long *)pObj < 0) {
              pLits[0] = iVar2;
            }
            if (*(long *)(CONCAT44(pNodeE._4_4_,(uint)pNodeE) & 0xfffffffffffffffe) < 0) {
              pLits[1] = uVar8;
            }
            if (*(long *)pNode < 0) {
              pLits[2] = uVar4;
            }
          }
          iVar3 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
          if (iVar3 != 0) {
            pLits[0] = iVar5;
            pLits[1] = uVar8;
            pLits[2] = uVar4;
            if (p->pPars->fPolarFlip != 0) {
              if (*(long *)pObj < 0) {
                pLits[0] = iVar2;
              }
              if (*(long *)(CONCAT44(pNodeE._4_4_,(uint)pNodeE) & 0xfffffffffffffffe) < 0) {
                pLits[1] = uVar9;
              }
              if (*(long *)pNode < 0) {
                pLits[2] = uVar1;
              }
            }
            iVar2 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
            if (iVar2 == 0) {
              __assert_fail("RetValue",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                            ,0x85,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
            }
            if ((int)local_38 != (int)local_40) {
              pLits[0] = uVar7;
              pLits[1] = uVar8;
              pLits[2] = uVar4;
              if (p->pPars->fPolarFlip != 0) {
                if (*(long *)((ulong)pNodeT & 0xfffffffffffffffe) < 0) {
                  pLits[0] = uVar6;
                }
                if (*(long *)(CONCAT44(pNodeE._4_4_,(uint)pNodeE) & 0xfffffffffffffffe) < 0) {
                  pLits[1] = uVar9;
                }
                if (*(long *)pNode < 0) {
                  pLits[2] = uVar1;
                }
              }
              iVar2 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
              if (iVar2 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                              ,0x9e,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
              }
              pLits[0] = uVar6;
              pLits[1] = uVar9;
              pLits[2] = uVar1;
              if (p->pPars->fPolarFlip != 0) {
                if (*(long *)((ulong)pNodeT & 0xfffffffffffffffe) < 0) {
                  pLits[0] = uVar7;
                }
                if (*(long *)(CONCAT44(pNodeE._4_4_,(uint)pNodeE) & 0xfffffffffffffffe) < 0) {
                  pLits[1] = uVar8;
                }
                if (*(long *)pNode < 0) {
                  pLits[2] = uVar4;
                }
              }
              iVar2 = sat_solver_addclause(p->pSat,pLits,pLits + 3);
              if (iVar2 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                              ,0xa9,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
              }
            }
            return;
          }
          __assertion = "RetValue";
          uVar1 = 0x7a;
        }
      }
    }
  }
  else {
    __assertion = "!Gia_IsComplement( pNode )";
    uVar1 = 0x45;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSolve.c"
                ,uVar1,"void Cec_AddClausesMux(Cec_ManSat_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_AddClausesMux( Cec_ManSat_t * p, Gia_Obj_t * pNode )
{
    Gia_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Gia_IsComplement( pNode ) );
    assert( Gia_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Gia_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Cec_ObjSatNum(p,pNode);
    VarI = Cec_ObjSatNum(p,pNodeI);
    VarT = Cec_ObjSatNum(p,Gia_Regular(pNodeT));
    VarE = Cec_ObjSatNum(p,Gia_Regular(pNodeE));
    // get the complementation flags
    fCompT = Gia_IsComplement(pNodeT);
    fCompE = Gia_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( Gia_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Gia_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}